

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::DumpRegStats(FunctionBody *this,FunctionBody *funcBody)

{
  uint uVar1;
  uint uVar2;
  
  if (funcBody->callCountStats != 0) {
    uVar2 = funcBody->regAllocStoreCount;
    uVar1 = funcBody->regAllocLoadCount;
    if (DAT_015bbe89 == '\x01') {
      uVar1 = uVar1 / this->callCountStats;
      uVar2 = uVar2 / this->callCountStats;
    }
    DumpFullFunctionName(funcBody);
    Output::SkipToColumn(0x37);
    Output::Print(L"Calls:%6d  Loads:%9d  Stores:%9d  Total refs:%9d\n",(ulong)this->callCountStats,
                  (ulong)uVar1,(ulong)uVar2,(ulong)(uVar2 + uVar1));
    return;
  }
  return;
}

Assistant:

void FunctionBody::DumpRegStats(FunctionBody *funcBody)
    {
        if (funcBody->callCountStats == 0)
        {
            return;
        }
        uint loads = funcBody->regAllocLoadCount;
        uint stores = funcBody->regAllocStoreCount;

        if (Js::Configuration::Global.flags.NormalizeStats)
        {
            loads /= this->callCountStats;
            stores /= this->callCountStats;
        }
        funcBody->DumpFullFunctionName();
        Output::SkipToColumn(55);
        Output::Print(_u("Calls:%6d  Loads:%9d  Stores:%9d  Total refs:%9d\n"), this->callCountStats,
            loads, stores, loads + stores);
    }